

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

Utils * __thiscall r_code::Utils::GetString_abi_cxx11_(Utils *this,Atom *iptr)

{
  byte bVar1;
  char local_118 [7];
  uint8_t char_count;
  char buffer [255];
  Atom *iptr_local;
  string *s;
  
  buffer[0xf7] = '\0';
  unique0x10000091 = iptr;
  std::__cxx11::string::string((string *)this);
  bVar1 = (byte)stack0xffffffffffffffe8->atom;
  memcpy(local_118,stack0xffffffffffffffe8 + 1,(ulong)bVar1);
  local_118[bVar1] = '\0';
  std::__cxx11::string::operator+=((string *)this,local_118);
  return this;
}

Assistant:

std::string Utils::GetString(const Atom *iptr)
{
    std::string s;
    char buffer[255];
    uint8_t char_count = (iptr[0].atom & 0x000000FF);
    memcpy(buffer, iptr + 1, char_count);
    buffer[char_count] = 0;
    s += buffer;
    return s;
}